

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O1

QVariant * __thiscall
QGenericItemModel::headerData
          (QVariant *__return_storage_ptr__,QGenericItemModel *this,int section,
          Orientation orientation,int role)

{
  long in_FS_OFFSET;
  int local_1c;
  Orientation local_18;
  int local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = role;
  local_18 = orientation;
  local_14 = section;
  QGenericItemModelImplBase::callConst<QVariant,int,Qt::Orientation,int>
            (__return_storage_ptr__,*(QGenericItemModelImplBase **)(this + 0x10),HeaderData,
             &local_14,&local_18,&local_1c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGenericItemModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    return impl->callConst<QVariant>(QGenericItemModelImplBase::HeaderData,
                                     section, orientation, role);
}